

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_equalp_bound(sexp ctx,sexp self,sexp_sint_t n,sexp a,sexp b,sexp depth,sexp bound)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  sexp_sint_t sVar5;
  anon_union_24768_35_b8e82fc1_for_value *__s1;
  sexp depth_00;
  size_t __n;
  void *__s2;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  long in_RDI;
  sexp in_R8;
  sexp in_R9;
  sexp unaff_retaddr;
  sexp in_stack_00000008;
  char *q_right;
  char *q_left;
  char *p_right;
  char *p_left;
  sexp depth2;
  sexp_conflict *q;
  sexp_conflict *p;
  sexp t;
  sexp_sint_t len;
  sexp_sint_t i;
  sexp_uint_t right_size;
  sexp_uint_t left_size;
  sexp in_stack_ffffffffffffff50;
  sexp in_stack_ffffffffffffff58;
  sexp local_a0;
  anon_union_24768_35_b8e82fc1_for_value *local_70;
  sexp local_68;
  long local_58;
  long local_50;
  sexp local_8;
  
  do {
    if (in_RCX == in_R8) {
      return in_stack_00000008;
    }
    if ((((in_RCX == (sexp)0x0) || (((ulong)in_RCX & 3) != 0)) || (in_R8 == (sexp)0x0)) ||
       ((((ulong)in_R8 & 3) != 0 || (in_RCX->tag != in_R8->tag)))) {
      local_8 = (sexp)&DAT_0000003e;
      return local_8;
    }
    if (in_RCX->tag == 0xc) {
      sVar5 = sexp_bignum_compare(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      if (sVar5 == 0) {
        local_a0 = in_stack_00000008;
      }
      else {
        local_a0 = (sexp)&DAT_0000003e;
      }
      return local_a0;
    }
    if (in_RCX->tag == 0xb) {
      if ((in_RCX->value).type.name == (in_R8->value).type.name) {
        return in_stack_00000008;
      }
      return (sexp)&DAT_0000003e;
    }
    auVar2._8_8_ = (long)in_stack_00000008 >> 0x3f;
    auVar2._0_8_ = (ulong)in_stack_00000008 & 0xfffffffffffffffe;
    if ((SUB168(auVar2 / SEXT816(2),0) < 0) ||
       (auVar3._8_8_ = (long)in_R9 >> 0x3f, auVar3._0_8_ = (ulong)in_R9 & 0xfffffffffffffffe,
       SUB168(auVar3 / SEXT816(2),0) < 0)) {
      return in_stack_00000008;
    }
    in_stack_00000008 = (sexp)((long)&in_stack_00000008[-1].value + 0x60be);
    lVar1 = *(long *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10 + (ulong)in_RCX->tag * 8);
    __s1 = &in_RCX->value;
    local_68 = (sexp)((long)&in_RCX->tag + (long)(int)*(short *)(lVar1 + 0x54));
    local_70 = (anon_union_24768_35_b8e82fc1_for_value *)
               ((long)&in_R8->tag + (long)(int)*(short *)(lVar1 + 0x54));
    if (local_68 == in_RCX) {
      local_70 = &in_R8->value;
      local_68 = (sexp)__s1;
    }
    depth_00 = (sexp)((long)local_68 - (long)__s1);
    if ((depth_00 != (sexp)0x0) && (iVar4 = memcmp(__s1,&in_R8->value,(size_t)depth_00), iVar4 != 0)
       ) {
      local_8 = (sexp)&DAT_0000003e;
      return local_8;
    }
    __n = (long)in_RCX +
          ((*(long *)((long)&in_RCX->tag + (long)(int)*(short *)(lVar1 + 0x60)) *
            (ulong)*(ushort *)(lVar1 + 0x62) + (long)*(short *)(lVar1 + 0x5e)) -
          (long)(&local_68->tag +
                (*(long *)((long)&in_RCX->tag + (long)(int)*(short *)(lVar1 + 0x5a)) *
                 (ulong)*(ushort *)(lVar1 + 0x5c) + (long)*(short *)(lVar1 + 0x58)) * 2));
    if (__n != 0) {
      __s2 = (void *)((long)local_70 +
                     (*(long *)((long)&in_R8->tag + (long)(int)*(short *)(lVar1 + 0x5a)) *
                      (ulong)*(ushort *)(lVar1 + 0x5c) + (long)*(short *)(lVar1 + 0x58)) * 8);
      if (__n != (long)in_R8 +
                 ((*(long *)((long)&in_R8->tag + (long)(int)*(short *)(lVar1 + 0x60)) *
                   (ulong)*(ushort *)(lVar1 + 0x62) + (long)*(short *)(lVar1 + 0x5e)) - (long)__s2))
      {
        local_8 = (sexp)&DAT_0000003e;
        return local_8;
      }
      iVar4 = memcmp(&local_68->tag +
                     (*(long *)((long)&in_RCX->tag + (long)(int)*(short *)(lVar1 + 0x5a)) *
                      (ulong)*(ushort *)(lVar1 + 0x5c) + (long)*(short *)(lVar1 + 0x58)) * 2,__s2,
                     __n);
      if (iVar4 != 0) {
        local_8 = (sexp)&DAT_0000003e;
        return local_8;
      }
    }
    local_58 = *(long *)((long)&in_RCX->tag + (long)(int)*(short *)(lVar1 + 0x5a)) *
               (ulong)*(ushort *)(lVar1 + 0x5c) + (long)*(short *)(lVar1 + 0x56);
    if (local_58 < 1) {
      return in_stack_00000008;
    }
    for (; 1 < local_58; local_58 = local_58 + -1) {
      in_RCX = *(sexp *)((long)local_68 + (local_58 + -1) * 8);
      in_R8 = *(sexp *)((long)local_70 + (local_58 + -1) * 8);
      if (in_RCX != in_R8) {
        if ((((in_RCX == (sexp)0x0) || (((ulong)in_RCX & 3) != 0)) || (in_R8 == (sexp)0x0)) ||
           ((((ulong)in_R8 & 3) != 0 || (in_RCX->tag != in_R8->tag)))) {
          local_8 = (sexp)&DAT_0000003e;
          return local_8;
        }
        break;
      }
    }
    for (local_50 = 0; local_50 < local_58 + -1; local_50 = local_50 + 1) {
      in_stack_00000008 =
           sexp_equalp_bound(in_RSI,in_RDX,(sexp_sint_t)in_RCX,in_R8,in_R9,depth_00,unaff_retaddr);
      if (in_stack_00000008 == (sexp)&DAT_0000003e) {
        local_8 = (sexp)&DAT_0000003e;
        return local_8;
      }
    }
    in_RCX = *(sexp *)((long)local_68 + (local_58 + -1) * 8);
    in_R8 = *(sexp *)((long)local_70 + (local_58 + -1) * 8);
  } while( true );
}

Assistant:

sexp sexp_equalp_bound (sexp ctx, sexp self, sexp_sint_t n, sexp a, sexp b, sexp depth, sexp bound) {
  sexp_uint_t left_size, right_size;
  sexp_sint_t i, len;
  sexp t, *p, *q, depth2;
  char *p_left, *p_right, *q_left, *q_right;

 loop:
  if (a == b)
    return bound;
  else if ((!a || !sexp_pointerp(a)) || (!b || !sexp_pointerp(b))
           || (sexp_pointer_tag(a) != sexp_pointer_tag(b)))
    return SEXP_FALSE;

  /* a and b are both pointers of the same type */
#if SEXP_USE_BIGNUMS
  if (sexp_pointer_tag(a) == SEXP_BIGNUM)
    return !sexp_bignum_compare(a, b) ? bound : SEXP_FALSE;
#endif
#if SEXP_USE_FLONUMS && ! SEXP_USE_IMMEDIATE_FLONUMS
  if (sexp_pointer_tag(a) == SEXP_FLONUM)
    return sexp_flonum_eqv(a, b) ? bound : SEXP_FALSE;
#endif
  /* check limits */
  if (sexp_unbox_fixnum(bound) < 0 || sexp_unbox_fixnum(depth) < 0)
    return bound;
  depth2 = sexp_fx_sub(depth, SEXP_ONE);
  bound = sexp_fx_sub(bound, SEXP_ONE);
  t = sexp_object_type(ctx, a);
  p_left = ((char*)a) + offsetof(struct sexp_struct, value);
  p = (sexp*) (((char*)a) + sexp_type_field_base(t));
  q_left = ((char*)b) + offsetof(struct sexp_struct, value);
  q = (sexp*) (((char*)b) + sexp_type_field_base(t));
  /* if no fields, the base is value (just past the header) */
  if ((sexp)p == a) {p=(sexp*)p_left; q=(sexp*)q_left;}
  /* check preliminary non-object data */
  left_size = (char*)p - p_left;
  if ((left_size > 0) && memcmp(p_left, q_left, left_size))
    return SEXP_FALSE;
  /* check trailing non-object data */
  p_right = ((char*)p + sexp_type_num_slots_of_object(t,a)*sizeof(sexp));
  right_size = ((char*)a + sexp_type_size_of_object(t, a)) - p_right;
  if (right_size > 0) {
    q_right = ((char*)q + sexp_type_num_slots_of_object(t,b)*sizeof(sexp));
    if (right_size != ((char*)b + sexp_type_size_of_object(t, b)) - q_right)
      return SEXP_FALSE;
    if (memcmp(p_right, q_right, right_size))
      return SEXP_FALSE;
  }
  /* left and right non-object data is the same, now check eq-object slots */
  len = sexp_type_num_eq_slots_of_object(t, a);
  if (len > 0) {
    for (; len > 1; len--) {
      a = p[len-1]; b = q[len-1];
      if (a != b) {
        if ((!a || !sexp_pointerp(a)) || (!b || !sexp_pointerp(b))
            || (sexp_pointer_tag(a) != sexp_pointer_tag(b)))
          return SEXP_FALSE;
        else break;
      }
    }
    for (i=0; i<len-1; i++) {
      bound = sexp_equalp_bound(ctx, self, n, p[i], q[i], depth2, bound);
      if (sexp_not(bound)) return SEXP_FALSE;
    }
    /* tail-recurse on the last value (same depth) */
    a = p[len-1]; b = q[len-1]; goto loop;
  }
  return bound;
}